

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

Vector3 GetCameraForward(Camera *camera)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  
  uVar1 = (camera->position).x;
  uVar3 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar4 = (camera->target).y;
  fVar7 = (float)uVar2 - (float)uVar1;
  fVar8 = (float)uVar4 - (float)uVar3;
  fVar6 = (camera->target).z - (camera->position).z;
  fVar5 = fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar5 = 1.0 / fVar5;
    fVar7 = fVar7 * fVar5;
    fVar8 = fVar8 * fVar5;
    fVar6 = fVar6 * fVar5;
  }
  VVar9.y = fVar8;
  VVar9.x = fVar7;
  VVar9.z = fVar6;
  return VVar9;
}

Assistant:

Vector3 GetCameraForward(Camera *camera)
{
    return Vector3Normalize(Vector3Subtract(camera->target, camera->position));
}